

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O1

void gpc_cb16(Pixel *out,Pixel *in,Background *back)

{
  int iVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  iVar1 = in->a;
  if (iVar1 < 1) {
    out->r = back->ir;
    out->g = back->ig;
    uVar2 = back->ib;
  }
  else {
    if (iVar1 < 0xffff) {
      dVar5 = 1.0 - (double)iVar1 / 65535.0;
      dVar4 = ((double)iVar1 / 65535.0) / 65535.0;
      dVar3 = (double)in->r * dVar4 + back->dr * dVar5;
      if (dVar3 <= 0.0031308) {
        dVar3 = dVar3 * 12.92;
      }
      else {
        dVar3 = pow(dVar3,0.4166666666666667);
        dVar3 = dVar3 * 1.055 + -0.055;
      }
      dVar3 = floor(dVar3 * 255.0 + 0.5);
      out->r = (int)dVar3 & 0xff;
      dVar3 = (double)in->g * dVar4 + back->dg * dVar5;
      if (dVar3 <= 0.0031308) {
        dVar3 = dVar3 * 12.92;
      }
      else {
        dVar3 = pow(dVar3,0.4166666666666667);
        dVar3 = dVar3 * 1.055 + -0.055;
      }
      dVar3 = floor(dVar3 * 255.0 + 0.5);
      out->g = (int)dVar3 & 0xff;
      dVar3 = (double)in->b * dVar4 + dVar5 * back->db;
    }
    else {
      dVar3 = (double)in->r / 65535.0;
      if (dVar3 <= 0.0031308) {
        dVar3 = dVar3 * 12.92;
      }
      else {
        dVar3 = pow(dVar3,0.4166666666666667);
        dVar3 = dVar3 * 1.055 + -0.055;
      }
      dVar3 = floor(dVar3 * 255.0 + 0.5);
      out->r = (int)dVar3 & 0xff;
      dVar3 = (double)in->g / 65535.0;
      if (dVar3 <= 0.0031308) {
        dVar3 = dVar3 * 12.92;
      }
      else {
        dVar3 = pow(dVar3,0.4166666666666667);
        dVar3 = dVar3 * 1.055 + -0.055;
      }
      dVar3 = floor(dVar3 * 255.0 + 0.5);
      out->g = (int)dVar3 & 0xff;
      dVar3 = (double)in->b / 65535.0;
    }
    if (dVar3 <= 0.0031308) {
      dVar3 = dVar3 * 12.92;
    }
    else {
      dVar3 = pow(dVar3,0.4166666666666667);
      dVar3 = dVar3 * 1.055 + -0.055;
    }
    dVar3 = floor(dVar3 * 255.0 + 0.5);
    uVar2 = (int)dVar3 & 0xff;
  }
  out->b = uVar2;
  out->a = 0xff;
  return;
}

Assistant:

static void
gpc_cb16(Pixel *out, const Pixel *in, const Background *back)
{
   if (in->a <= 0)
   {
      out->r = back->ir;
      out->g = back->ig;
      out->b = back->ib;
   }

   else if (in->a >= 65535)
   {
      out->r = isRGB(in->r);
      out->g = isRGB(in->g);
      out->b = isRGB(in->b);
   }

   else
   {
      double a = in->a / 65535.;
      double a1 = 1-a;

      a /= 65535;
      out->r = sRGB(in->r * a + back->dr * a1);
      out->g = sRGB(in->g * a + back->dg * a1);
      out->b = sRGB(in->b * a + back->db * a1);
   }

   out->a = 255;
}